

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockaction.cc
# Opt level: O2

void __thiscall
ConditionalJoin::cutDownMultiequals(ConditionalJoin *this,BlockBasic *exit,int4 in1,int4 in2)

{
  OpCode OVar1;
  _List_node_base *p_Var2;
  PcodeOp *op;
  pointer ppVVar3;
  Varnode *pVVar4;
  Varnode *pVVar5;
  long lVar6;
  _List_node_base *p_Var7;
  mapped_type *ppVVar8;
  int4 slot;
  key_type local_40;
  
  slot = in2;
  if (in2 < in1) {
    slot = in1;
  }
  lVar6 = (long)in2;
  if (in1 < in2) {
    in2 = in1;
  }
  p_Var7 = (exit->op).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while( true ) {
    do {
      if (p_Var7 == (_List_node_base *)&exit->op) {
        return;
      }
      p_Var2 = p_Var7->_M_next;
      op = (PcodeOp *)p_Var7[1]._M_next;
      OVar1 = op->opcode->opcode;
      p_Var7 = p_Var2;
    } while (OVar1 == CPUI_COPY);
    if (OVar1 != CPUI_MULTIEQUAL) break;
    ppVVar3 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar4 = ppVVar3[in1];
    pVVar5 = ppVVar3[lVar6];
    if (pVVar4 == pVVar5) {
      Funcdata::opRemoveInput(this->data,op,slot);
    }
    else {
      local_40.side1 = pVVar4;
      local_40.side2 = pVVar5;
      ppVVar8 = std::
                map<ConditionalJoin::MergePair,_Varnode_*,_std::less<ConditionalJoin::MergePair>,_std::allocator<std::pair<const_ConditionalJoin::MergePair,_Varnode_*>_>_>
                ::operator[](&this->mergeneed,&local_40);
      pVVar4 = *ppVVar8;
      Funcdata::opRemoveInput(this->data,op,slot);
      Funcdata::opSetInput(this->data,op,pVVar4,in2);
    }
    if (((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start & 0x7fffffff8U) == 8) {
      Funcdata::opUninsert(this->data,op);
      Funcdata::opSetOpcode(this->data,op,CPUI_COPY);
      Funcdata::opInsertBegin(this->data,op,exit);
    }
  }
  return;
}

Assistant:

void ConditionalJoin::cutDownMultiequals(BlockBasic *exit,int4 in1,int4 in2)

{
  list<PcodeOp *>::const_iterator iter,enditer;

  int4 lo,hi;
  if (in1 > in2) {
    hi = in1;
    lo = in2;
  }
  else {
    hi = in2;
    lo = in1;
  }
  iter = exit->beginOp();
  enditer = exit->endOp();
  while(iter != enditer) {
    PcodeOp *op = *iter;
    ++iter;			// Advance iterator before inserts happen
    if (op->code() == CPUI_MULTIEQUAL) {
      Varnode *vn1 = op->getIn(in1);
      Varnode *vn2 = op->getIn(in2);
      if (vn1 == vn2) {
	data.opRemoveInput(op,hi);
      }
      else {
	Varnode *subvn = mergeneed[ MergePair(vn1,vn2) ];
	data.opRemoveInput(op,hi);
	data.opSetInput(op,subvn,lo);
      }
      if (op->numInput() == 1) {
	data.opUninsert(op);
	data.opSetOpcode(op,CPUI_COPY);
	data.opInsertBegin(op,exit);
      }
    }
    else if (op->code() != CPUI_COPY) break;
  }
}